

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void non_existent_scandir_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_dirent_t dent;
  undefined1 local_10 [16];
  
  if (req == &scandir_req) {
    if (scandir_req.fs_type == UV_FS_SCANDIR) {
      if (scandir_req.result == -2) {
        if (scandir_req.ptr == (void *)0x0) {
          iVar1 = uv_fs_scandir_next(&scandir_req,local_10);
          if (iVar1 == -2) {
            uv_fs_req_cleanup(&scandir_req);
            scandir_cb_count = scandir_cb_count + 1;
            return;
          }
          pcVar3 = "UV_ENOENT == uv_fs_scandir_next(req, &dent)";
          uVar2 = 0x289;
        }
        else {
          pcVar3 = "req->ptr == NULL";
          uVar2 = 0x288;
        }
      }
      else {
        pcVar3 = "req->result == UV_ENOENT";
        uVar2 = 0x287;
      }
    }
    else {
      pcVar3 = "req->fs_type == UV_FS_SCANDIR";
      uVar2 = 0x286;
    }
  }
  else {
    pcVar3 = "req == &scandir_req";
    uVar2 = 0x285;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void non_existent_scandir_cb(uv_fs_t* req) {
  uv_dirent_t dent;

  ASSERT(req == &scandir_req);
  ASSERT(req->fs_type == UV_FS_SCANDIR);
  ASSERT(req->result == UV_ENOENT);
  ASSERT(req->ptr == NULL);
  ASSERT(UV_ENOENT == uv_fs_scandir_next(req, &dent));
  uv_fs_req_cleanup(req);
  scandir_cb_count++;
}